

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cpp
# Opt level: O2

bool __thiscall
anon_unknown.dwarf_ea566c::ConstPubkeyProvider::ToPrivateString
          (ConstPubkeyProvider *this,SigningProvider *arg,string *ret)

{
  secure_unique_ptr<KeyType> sVar1;
  long in_FS_OFFSET;
  CKey key;
  _Vector_base<CKeyID,_std::allocator<CKeyID>_> local_80;
  CKey local_68;
  string local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_68.fCompressed = false;
  local_68.keydata._M_t.
  super___uniq_ptr_impl<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::array<unsigned_char,_32UL>_*,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
  .super__Head_base<0UL,_std::array<unsigned_char,_32UL>_*,_false>._M_head_impl =
       (__uniq_ptr_data<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>,_true,_true>
        )(__uniq_ptr_impl<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
          )0x0;
  if (this->m_xonly == true) {
    XOnlyPubKey::XOnlyPubKey
              ((XOnlyPubKey *)&local_58,(CPubKey *)&(this->super_PubkeyProvider).field_0xc);
    XOnlyPubKey::GetKeyIDs
              ((vector<CKeyID,_std::allocator<CKeyID>_> *)&local_80,(XOnlyPubKey *)&local_58);
    do {
      if (local_80._M_impl.super__Vector_impl_data._M_start ==
          local_80._M_impl.super__Vector_impl_data._M_finish) break;
      (*arg->_vptr_SigningProvider[5])
                (arg,local_80._M_impl.super__Vector_impl_data._M_start,&local_68);
      local_80._M_impl.super__Vector_impl_data._M_start =
           local_80._M_impl.super__Vector_impl_data._M_start + 1;
    } while (local_68.keydata._M_t.
             super___uniq_ptr_impl<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_std::array<unsigned_char,_32UL>_*,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
             .super__Head_base<0UL,_std::array<unsigned_char,_32UL>_*,_false>._M_head_impl ==
             (__uniq_ptr_impl<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
              )0x0);
    std::_Vector_base<CKeyID,_std::allocator<CKeyID>_>::~_Vector_base(&local_80);
  }
  else {
    CPubKey::GetID((CKeyID *)&local_58,(CPubKey *)&(this->super_PubkeyProvider).field_0xc);
    (*arg->_vptr_SigningProvider[5])(arg,&local_58,&local_68);
  }
  sVar1._M_t.
  super___uniq_ptr_impl<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::array<unsigned_char,_32UL>_*,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
  .super__Head_base<0UL,_std::array<unsigned_char,_32UL>_*,_false>._M_head_impl =
       (__uniq_ptr_data<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>,_true,_true>
        )(__uniq_ptr_data<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>,_true,_true>
          )local_68.keydata;
  if (local_68.keydata._M_t.
      super___uniq_ptr_impl<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::array<unsigned_char,_32UL>_*,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
      .super__Head_base<0UL,_std::array<unsigned_char,_32UL>_*,_false>._M_head_impl !=
      (__uniq_ptr_impl<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
       )0x0) {
    EncodeSecret_abi_cxx11_(&local_58,&local_68);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              (ret,&local_58);
    std::__cxx11::string::~string((string *)&local_58);
  }
  std::
  unique_ptr<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
  ::~unique_ptr(&local_68.keydata);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return sVar1._M_t.
           super___uniq_ptr_impl<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
           ._M_t.
           super__Tuple_impl<0UL,_std::array<unsigned_char,_32UL>_*,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
           .super__Head_base<0UL,_std::array<unsigned_char,_32UL>_*,_false>._M_head_impl !=
           (__uniq_ptr_impl<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
            )0x0;
  }
  __stack_chk_fail();
}

Assistant:

bool ToPrivateString(const SigningProvider& arg, std::string& ret) const override
    {
        CKey key;
        if (m_xonly) {
            for (const auto& keyid : XOnlyPubKey(m_pubkey).GetKeyIDs()) {
                arg.GetKey(keyid, key);
                if (key.IsValid()) break;
            }
        } else {
            arg.GetKey(m_pubkey.GetID(), key);
        }
        if (!key.IsValid()) return false;
        ret = EncodeSecret(key);
        return true;
    }